

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_page_element * nk_create_page_element(nk_context *ctx)

{
  nk_page_element *local_20;
  nk_page_element *elem;
  nk_context *ctx_local;
  
  if (ctx->freelist == (nk_page_element *)0x0) {
    if (ctx->use_pool == 0) {
      local_20 = (nk_page_element *)nk_buffer_alloc(&ctx->memory,NK_BUFFER_BACK,0x200,8);
      if (local_20 == (nk_page_element *)0x0) {
        __assert_fail("elem",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                      ,0x3bc3,"struct nk_page_element *nk_create_page_element(struct nk_context *)")
        ;
      }
      if (local_20 == (nk_page_element *)0x0) {
        return (nk_page_element *)0x0;
      }
    }
    else {
      local_20 = nk_pool_alloc(&ctx->pool);
      if (local_20 == (nk_page_element *)0x0) {
        __assert_fail("elem",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                      ,0x3bbc,"struct nk_page_element *nk_create_page_element(struct nk_context *)")
        ;
      }
      if (local_20 == (nk_page_element *)0x0) {
        return (nk_page_element *)0x0;
      }
    }
  }
  else {
    local_20 = ctx->freelist;
    ctx->freelist = local_20->next;
  }
  nk_zero(local_20,0x200);
  local_20->next = (nk_page_element *)0x0;
  local_20->prev = (nk_page_element *)0x0;
  return local_20;
}

Assistant:

NK_LIB struct nk_page_element*
nk_create_page_element(struct nk_context *ctx)
{
    struct nk_page_element *elem;
    if (ctx->freelist) {
        /* unlink page element from free list */
        elem = ctx->freelist;
        ctx->freelist = elem->next;
    } else if (ctx->use_pool) {
        /* allocate page element from memory pool */
        elem = nk_pool_alloc(&ctx->pool);
        NK_ASSERT(elem);
        if (!elem) return 0;
    } else {
        /* allocate new page element from back of fixed size memory buffer */
        NK_STORAGE const nk_size size = sizeof(struct nk_page_element);
        NK_STORAGE const nk_size align = NK_ALIGNOF(struct nk_page_element);
        elem = (struct nk_page_element*)nk_buffer_alloc(&ctx->memory, NK_BUFFER_BACK, size, align);
        NK_ASSERT(elem);
        if (!elem) return 0;
    }
    nk_zero_struct(*elem);
    elem->next = 0;
    elem->prev = 0;
    return elem;
}